

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_printUsage_TestShell::~TEST_CommandLineArguments_printUsage_TestShell
          (TEST_CommandLineArguments_printUsage_TestShell *this)

{
  TEST_CommandLineArguments_printUsage_TestShell *this_local;
  
  ~TEST_CommandLineArguments_printUsage_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CommandLineArguments, printUsage)
{
    STRCMP_EQUAL(
            "use -h for more extensive help\n"
            "usage [-h] [-v] [-vv] [-c] [-p] [-lg] [-ln] [-ll] [-ri] [-r[<#>]] [-f] [-e] [-ci]\n"
            "      [-g|sg|xg|xsg <groupName>]... [-n|sn|xn|xsn <testName>]... [-t|st|xt|xst <groupName>.<testName>]...\n"
            "      [-b] [-s [<seed>]] [\"[IGNORE_]TEST(<groupName>, <testName>)\"]...\n"
            "      [-o{normal|eclipse|junit|teamcity}] [-k <packageName>]\n",
            args->usage());
}